

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::process_stmt(Simulator *this,Stmt *stmt,Var *var)

{
  StatementType SVar1;
  StatementBlockType SVar2;
  runtime_error *this_00;
  SwitchStmt *switch_;
  IfStmt *if_;
  StmtBlock *block;
  AssignStmt *assign;
  Var *var_local;
  Stmt *stmt_local;
  Simulator *this_local;
  
  SVar1 = Stmt::type(stmt);
  switch(SVar1) {
  case If:
    process_stmt(this,(IfStmt *)stmt,var);
    break;
  case Switch:
    process_stmt(this,(SwitchStmt *)stmt,var);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not implemented");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case Assign:
    process_stmt(this,(AssignStmt *)stmt,var);
    break;
  case Block:
    SVar2 = StmtBlock::block_type((StmtBlock *)stmt);
    if (SVar2 == Combinational) {
      process_stmt(this,(CombinationalStmtBlock *)stmt,var);
    }
    else {
      SVar2 = StmtBlock::block_type((StmtBlock *)stmt);
      if (SVar2 == Sequential) {
        process_stmt(this,(SequentialStmtBlock *)stmt,var);
      }
      else {
        process_stmt(this,(StmtBlock *)stmt,var);
      }
    }
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::Stmt *stmt, const Var *var) {
    switch (stmt->type()) {
        case StatementType::Assign: {
            auto *assign = reinterpret_cast<AssignStmt *>(stmt);
            process_stmt(assign, var);
            break;
        }
        case StatementType::Block: {
            auto *block = reinterpret_cast<StmtBlock *>(stmt);
            if (block->block_type() == StatementBlockType::Combinational) {
                process_stmt(reinterpret_cast<CombinationalStmtBlock *>(block), var);
            } else if (block->block_type() == StatementBlockType::Sequential) {
                process_stmt(reinterpret_cast<SequentialStmtBlock *>(block), var);
            } else {
                process_stmt(block, var);
            }
            break;
        }
        case StatementType::If: {
            auto *if_ = reinterpret_cast<IfStmt *>(stmt);
            process_stmt(if_, var);
            break;
        }
        case StatementType::Switch: {
            auto *switch_ = reinterpret_cast<SwitchStmt *>(stmt);
            process_stmt(switch_, var);
            break;
        }
        default:
            throw std::runtime_error("Not implemented");
    }
}